

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,longdouble kappa,
          longdouble delta,longdouble theta)

{
  int *piVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar2;
  undefined4 uVar3;
  uint uVar4;
  rc_size rVar5;
  undefined8 extraout_RAX;
  row_iterator prVar6;
  long lVar7;
  ulong uVar8;
  rc_data *prVar9;
  long lVar10;
  uint r_size;
  rc_data *__first;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_ac;
  int local_a8;
  undefined4 local_a4;
  rc_data *local_a0;
  int *local_98;
  bit_array *local_90;
  int *local_88;
  solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>
  *local_80;
  undefined1 local_78 [16];
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "update-row {} {} {}\n";
  fmt._M_len = 0x14;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  if (first._M_current == last._M_current) {
    uVar3 = 0;
  }
  else {
    local_80 = this + 0x10;
    uVar3 = 0;
    local_90 = x;
    local_88 = last._M_current;
    do {
      local_ac = *first._M_current;
      if (*(int *)(this + 0x80) <= local_ac) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_a4 = uVar3;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_78,(int)local_80);
      if (local_78._8_8_ != local_78._0_8_) {
        lVar7 = *(long *)(this + 0x50);
        prVar6 = (row_iterator)local_78._8_8_;
        do {
          piVar1 = &prVar6->value;
          prVar6 = prVar6 + 1;
          lVar10 = (long)*piVar1 * 0x10;
          *(longdouble *)(lVar7 + lVar10) = *(longdouble *)(lVar7 + lVar10) * local_68;
        } while (prVar6 != (row_iterator)local_78._0_8_);
      }
      rVar5 = solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                          *)this,(row_iterator)local_78._8_8_,(row_iterator)local_78._0_8_,x);
      r_size = rVar5.r_size;
      lVar7 = (long)(int)r_size;
      if (1 < lVar7) {
        __first = *(rc_data **)(this + 0x60);
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        prVar9 = __first + lVar7;
        local_98 = first._M_current;
        std::
        __introsort_loop<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar9,(int)LZCOUNT(lVar7) * 2 ^ 0x7e);
        local_a0 = prVar9;
        std::
        __final_insertion_sort<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar9);
        lVar7 = lVar7 * 0x20 + -0x20;
        prVar9 = __first;
        do {
          prVar9 = prVar9 + 1;
          if ((__first->value != prVar9->value) || (NAN(__first->value) || NAN(prVar9->value))) {
            std::
            shuffle<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,prVar9,__g);
            __first = prVar9;
          }
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != 0);
        std::
        shuffle<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,local_a0,__g);
        first._M_current = local_98;
      }
      piVar1 = (int *)(*(long *)(this + 0x68) + (long)local_ac * 8);
      uVar4 = rVar5.c_size + *piVar1;
      if ((int)r_size < (int)uVar4) {
        uVar4 = r_size;
      }
      local_a8 = uVar4 - 1;
      fmt_00._M_str = "constraints {}: {} = ";
      fmt_00._M_len = 0x15;
      debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&local_ac,piVar1);
      if (0 < (int)r_size) {
        uVar8 = (ulong)(r_size & 0x7fffffff);
        lVar7 = 0x14;
        do {
          fmt_01._M_str = "{} ({}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<long_double,int>
                    ((debug_logger<true> *)this,fmt_01,
                     (longdouble *)(*(long *)(this + 0x60) + -0x14 + lVar7),
                     (int *)(*(long *)(this + 0x60) + lVar7));
          lVar7 = lVar7 + 0x20;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      fmt_02._M_str = " => Selected: {}\n";
      fmt_02._M_len = 0x11;
      debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&local_a8);
      x = local_90;
      bVar2 = affect<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                          *)this,local_90,(row_value *)local_78._8_8_,local_ac,local_a8,r_size,
                         local_48,local_58);
      first._M_current = first._M_current + 1;
      uVar3 = CONCAT31((int3)((uint)local_a4 >> 8),(byte)local_a4 | bVar2);
    } while (first._M_current != local_88);
  }
  return (bool)((byte)uVar3 & 1);
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }